

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O1

void anon_unknown.dwarf_241453::crypto_polyval_update_blocks
               (polyval_ctx *ctx,uint8_t *in,size_t in_len)

{
  size_t __n;
  uint8_t buf [512];
  undefined1 local_230 [512];
  
  if ((in_len & 0xf) != 0) {
    __assert_fail("(in_len & 15) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                  ,0x29f,
                  "void (anonymous namespace)::crypto_polyval_update_blocks(struct polyval_ctx *, const uint8_t *, size_t)"
                 );
  }
  if (in_len != 0) {
    __n = 0x200;
    if (in_len < 0x200) {
      __n = in_len;
    }
    memcpy(local_230,in,__n);
  }
  return;
}

Assistant:

void crypto_polyval_update_blocks(struct polyval_ctx *ctx, const uint8_t *in,
                                  size_t in_len) {
  assert((in_len & 15) == 0);
  alignas(8) uint8_t buf[32 * 16];

  while (in_len > 0) {
    size_t todo = in_len;
    if (todo > sizeof(buf)) {
      todo = sizeof(buf);
    }
    OPENSSL_memcpy(buf, in, todo);
    in += todo;
    in_len -= todo;

    size_t blocks = todo / 16;
    for (size_t i = 0; i < blocks; i++) {
      byte_reverse(buf + 16 * i);
    }

    ctx->ghash(ctx->S, ctx->Htable, buf, todo);
  }
}